

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O1

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
MPSgetRHS<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *__return_storage_ptr__,soplex *this,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *left,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *right)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  double *pdVar5;
  undefined8 *puVar6;
  cpp_dec_float<50U,_int,_void> local_78;
  double local_38;
  undefined8 uStack_30;
  
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 10;
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x1d) = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x25) = 0;
  ::soplex::infinity::__tls_init();
  pdVar5 = (double *)__tls_get_addr(&PTR_003b6b60);
  local_38 = *pdVar5;
  uStack_30 = 0;
  local_78.fpclass = cpp_dec_float_finite;
  local_78.prec_elem = 10;
  local_78.data._M_elems[0] = 0;
  local_78.data._M_elems[1] = 0;
  local_78.data._M_elems[2] = 0;
  local_78.data._M_elems[3] = 0;
  local_78.data._M_elems[4] = 0;
  local_78.data._M_elems[5] = 0;
  local_78.data._M_elems._24_5_ = 0;
  local_78.data._M_elems[7]._1_3_ = 0;
  local_78.data._M_elems._32_5_ = 0;
  local_78._37_8_ = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_78,-local_38);
  if (((*(int *)(this + 0x30) == 2) || (local_78.fpclass == cpp_dec_float_NaN)) ||
     (iVar4 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                        ((cpp_dec_float<50U,_int,_void> *)this,&local_78), iVar4 < 1)) {
    ::soplex::infinity::__tls_init();
    local_78.fpclass = cpp_dec_float_finite;
    local_78.prec_elem = 10;
    local_78.data._M_elems[0] = 0;
    local_78.data._M_elems[1] = 0;
    local_78.data._M_elems[2] = 0;
    local_78.data._M_elems[3] = 0;
    local_78.data._M_elems[4] = 0;
    local_78.data._M_elems[5] = 0;
    local_78.data._M_elems._24_5_ = 0;
    local_78.data._M_elems[7]._1_3_ = 0;
    local_78.data._M_elems._32_5_ = 0;
    local_78._37_8_ = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_78,local_38);
    if ((((left->m_backend).fpclass == cpp_dec_float_NaN) || (local_78.fpclass == cpp_dec_float_NaN)
        ) || (iVar4 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&left->m_backend,&local_78), this = (soplex *)left, -1 < iVar4)) {
      puVar6 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_78.data._M_elems._0_8_ = local_78.data._M_elems + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"XMPSWR01 This should never happen.","");
      *puVar6 = &PTR__SPxException_003af870;
      puVar6[1] = puVar6 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar6 + 1),local_78.data._M_elems._0_8_,
                 local_78.data._M_elems._0_8_ + local_78.data._M_elems._8_8_);
      *puVar6 = &PTR__SPxException_003b0638;
      __cxa_throw(puVar6,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
  }
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
       *(undefined8 *)(this + 0x20);
  uVar1 = *(undefined8 *)this;
  uVar2 = *(undefined8 *)(this + 8);
  uVar3 = *(undefined8 *)(this + 0x18);
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
       *(undefined8 *)(this + 0x10);
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) = uVar3;
  *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems = uVar1;
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) = uVar2;
  (__return_storage_ptr__->m_backend).exp = *(int *)(this + 0x28);
  (__return_storage_ptr__->m_backend).neg = (bool)this[0x2c];
  (__return_storage_ptr__->m_backend).fpclass = *(fpclass_type *)(this + 0x30);
  (__return_storage_ptr__->m_backend).prec_elem = *(int32_t *)(this + 0x34);
  return __return_storage_ptr__;
}

Assistant:

static R MPSgetRHS(R left, R right)
{
   R rhsval;

   if(left > R(-infinity))   /// This includes ranges
      rhsval = left;
   else if(right <  R(infinity))
      rhsval = right;
   else
      throw SPxInternalCodeException("XMPSWR01 This should never happen.");

   return rhsval;
}